

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::Putc(XMLPrinter *this,char ch)

{
  int iVar1;
  char *pcVar2;
  
  if ((FILE *)this->_fp != (FILE *)0x0) {
    fputc((int)ch,(FILE *)this->_fp);
    return;
  }
  DynArray<char,_20>::EnsureCapacity(&this->_buffer,(this->_buffer)._size + 1);
  pcVar2 = (this->_buffer)._mem;
  iVar1 = (this->_buffer)._size;
  (this->_buffer)._size = iVar1 + 1;
  pcVar2[(long)iVar1 + -1] = ch;
  pcVar2[iVar1] = '\0';
  return;
}

Assistant:

void XMLPrinter::Putc( char ch )
{
    if ( _fp ) {
        fputc ( ch, _fp);
    }
    else {
        char* p = _buffer.PushArr( sizeof(char) ) - 1;   // back up over the null terminator.
        p[0] = ch;
        p[1] = 0;
    }
}